

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O0

void on_message_send_complete
               (void *context,MESSAGE_SEND_RESULT send_result,AMQP_VALUE delivery_state)

{
  long lVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  long *plVar4;
  LOGGER_LOG l_1;
  AMQP_MANAGEMENT_HANDLE amqp_management;
  OPERATION_MESSAGE_INSTANCE *pending_operation_message;
  LIST_ITEM_HANDLE pending_operation_list_item_handle;
  LOGGER_LOG l;
  AMQP_VALUE delivery_state_local;
  MESSAGE_SEND_RESULT send_result_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_send_complete",0x169,1,"NULL context");
    }
  }
  else {
    plVar4 = (long *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)context);
    if (send_result == MESSAGE_SEND_OK) {
      *(undefined1 *)(plVar4 + 3) = 1;
      plVar4[5] = 0;
    }
    else if (send_result != MESSAGE_SEND_CANCELLED) {
      lVar1 = plVar4[4];
      iVar2 = singlylinkedlist_remove
                        (*(SINGLYLINKEDLIST_HANDLE *)(lVar1 + 0x20),(LIST_ITEM_HANDLE)context);
      if (iVar2 == 0) {
        if (*plVar4 != 0) {
          (*(code *)*plVar4)(plVar4[1],2,0,0);
        }
        async_operation_destroy((ASYNC_OPERATION_HANDLE)plVar4[6]);
      }
      else {
        (**(code **)(lVar1 + 0x40))();
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                    ,"on_message_send_complete",0x187,1,"Cannot remove pending operation");
        }
      }
    }
  }
  return;
}

Assistant:

static void on_message_send_complete(void* context, MESSAGE_SEND_RESULT send_result, AMQP_VALUE delivery_state)
{
    (void)delivery_state;

    if (context == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_167: [ When `on_message_send_complete` is called with a NULL context it shall return. ]*/
        LogError("NULL context");
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_168: [ - `context` shall be used as a LIST_ITEM_HANDLE containing the pending operation. ]*/
        LIST_ITEM_HANDLE pending_operation_list_item_handle = (LIST_ITEM_HANDLE)context;

        /* Codes_SRS_AMQP_MANAGEMENT_01_169: [ - `on_message_send_complete` shall obtain the pending operation by calling `singlylinkedlist_item_get_value`. ]*/
        OPERATION_MESSAGE_INSTANCE* pending_operation_message = (OPERATION_MESSAGE_INSTANCE*)singlylinkedlist_item_get_value(pending_operation_list_item_handle);

        if (send_result == MESSAGE_SEND_OK)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_170: [ If `send_result` is `MESSAGE_SEND_OK`, `on_message_send_complete` shall return. ]*/
            pending_operation_message->message_send_confirmed = true;
            pending_operation_message->send_async_context = NULL;
        }
        else if (send_result == MESSAGE_SEND_CANCELLED)
        {
            // Nothing to be done.
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_172: [ If `send_result` is different then `MESSAGE_SEND_OK`: ]*/
            AMQP_MANAGEMENT_HANDLE amqp_management = pending_operation_message->amqp_management;

            /* Codes_SRS_AMQP_MANAGEMENT_01_171: [ - `on_message_send_complete` shall removed the pending operation from the pending operations list. ]*/
            if (singlylinkedlist_remove(amqp_management->pending_operations, pending_operation_list_item_handle) != 0)
            {
                /* Tests_SRS_AMQP_MANAGEMENT_01_174: [ If any error occurs in removing the pending operation from the list `on_amqp_management_error` callback shall be invoked while passing the `on_amqp_management_error_context` as argument. ]*/
                amqp_management->on_amqp_management_error(amqp_management->on_amqp_management_error_context);
                LogError("Cannot remove pending operation");
            }
            else
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_173: [ - The callback associated with the pending operation shall be called with `AMQP_MANAGEMENT_EXECUTE_OPERATION_ERROR`. ]*/
                if (pending_operation_message->on_execute_operation_complete != NULL)
                {
                    // Check for NULL in case operation has been cancelled.
                    pending_operation_message->on_execute_operation_complete(pending_operation_message->callback_context, AMQP_MANAGEMENT_EXECUTE_OPERATION_ERROR, 0, NULL, NULL);
                }

                async_operation_destroy(pending_operation_message->execute_async_operation);
            }
        }
    }
}